

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O0

string * __thiscall
wabt::interp::Thread::TraceSource::Pick_abi_cxx11_
          (string *__return_storage_ptr__,TraceSource *this,Index index,Instr instr)

{
  char *pcVar1;
  Enum EVar2;
  Enum EVar3;
  u32 uVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  Value *pVVar9;
  u64 uVar10;
  Ref RVar11;
  f32 fVar12;
  undefined1 local_59 [8];
  v128 v;
  Type local_3c;
  char *pcStack_38;
  Type type;
  char *reftype;
  Value val;
  TraceSource *pTStack_18;
  Index index_local;
  TraceSource *this_local;
  
  val._12_4_ = index;
  pTStack_18 = this;
  this_local = (TraceSource *)__return_storage_ptr__;
  pVVar9 = Thread::Pick(this->thread_,index);
  reftype = (char *)pVVar9->i64_;
  val.i64_ = *(undefined8 *)((pVVar9->v128_).v + 8);
  local_3c = Opcode::GetParamType(&instr.op,val._12_4_);
  EVar2 = Type::operator_cast_to_Enum(&local_3c);
  if (EVar2 == Void) {
    EVar3 = Opcode::operator_cast_to_Enum(&instr.op);
    if (EVar3 - LocalSet < 2) {
      register0x00000000 = GetLocalType(this,instr.field_2.imm_u32);
      local_3c.enum_ = register0x00000000;
    }
    else if (EVar3 == GlobalSet) {
      local_3c.enum_ = (Enum)GetGlobalType(this,instr.field_2.imm_u32);
    }
    else {
      if ((1 < EVar3 - TableSet) && (EVar3 != TableFill)) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)__return_storage_ptr__,"?",(allocator *)(v.v + 8));
        std::allocator<char>::~allocator((allocator<char> *)(v.v + 8));
        return __return_storage_ptr__;
      }
      v.v._9_4_ = GetTableElementType(this,instr.field_2.imm_u32);
      local_3c.enum_ = v.v._9_4_;
    }
  }
  EVar2 = Type::operator_cast_to_Enum(&local_3c);
  switch(EVar2) {
  case Exnref:
    pcStack_38 = "exnref";
    goto LAB_00233f4f;
  default:
    abort();
  case Nullref:
    pcStack_38 = "nullref";
    goto LAB_00233f4f;
  case Anyref:
    pcStack_38 = "anyref";
    goto LAB_00233f4f;
  case Funcref:
    pcStack_38 = "funcref";
LAB_00233f4f:
    pcVar1 = pcStack_38;
    RVar11 = Value::Get<wabt::interp::Ref>((Value *)&reftype);
    StringPrintf_abi_cxx11_(__return_storage_ptr__,"%s:%zd",pcVar1,RVar11.index);
    break;
  case V128:
    _local_59 = Value::Get<v128>((Value *)&reftype);
    uVar5 = v128::u32((v128 *)local_59,0);
    uVar6 = v128::u32((v128 *)local_59,1);
    uVar7 = v128::u32((v128 *)local_59,2);
    uVar8 = v128::u32((v128 *)local_59,3);
    StringPrintf_abi_cxx11_
              (__return_storage_ptr__,"0x%08x 0x%08x 0x%08x 0x%08x",(ulong)uVar5,(ulong)uVar6,
               (ulong)uVar7,(ulong)uVar8);
    break;
  case F64:
    Value::Get<double>((Value *)&reftype);
    StringPrintf_abi_cxx11_(__return_storage_ptr__,"%g");
    break;
  case F32:
    fVar12 = Value::Get<float>((Value *)&reftype);
    StringPrintf_abi_cxx11_(__return_storage_ptr__,"%g",(double)(float)fVar12);
    break;
  case I64:
    uVar10 = Value::Get<unsigned_long>((Value *)&reftype);
    StringPrintf_abi_cxx11_(__return_storage_ptr__,"%lu",uVar10);
    break;
  case I32:
    uVar4 = Value::Get<unsigned_int>((Value *)&reftype);
    StringPrintf_abi_cxx11_(__return_storage_ptr__,"%u",(ulong)uVar4);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Thread::TraceSource::Pick(Index index, Instr instr) {
  Value val = thread_->Pick(index);
  const char* reftype;
  // TODO: the opcode index and pick index go in opposite directions.
  auto type = instr.op.GetParamType(index);
  if (type == ValueType::Void) {
    // Void should never be displayed normally; we only expect to see it when
    // the stack may have different a different type. This is likely to occur
    // with an index; try to see which type we should expect.
    switch (instr.op) {
      case Opcode::GlobalSet: type = GetGlobalType(instr.imm_u32); break;
      case Opcode::LocalSet:
      case Opcode::LocalTee:  type = GetLocalType(instr.imm_u32); break;
      case Opcode::TableSet:
      case Opcode::TableGrow:
      case Opcode::TableFill: type = GetTableElementType(instr.imm_u32); break;
      default: return "?";
    }
  }

  switch (type) {
    case ValueType::I32: return StringPrintf("%u", val.Get<u32>());
    case ValueType::I64: return StringPrintf("%" PRIu64, val.Get<u64>());
    case ValueType::F32: return StringPrintf("%g", val.Get<f32>());
    case ValueType::F64: return StringPrintf("%g", val.Get<f64>());
    case ValueType::V128: {
      auto v = val.Get<v128>();
      return StringPrintf("0x%08x 0x%08x 0x%08x 0x%08x", v.u32(0), v.u32(1),
                          v.u32(2), v.u32(3));
    }

    case ValueType::Nullref: reftype = "nullref"; break;
    case ValueType::Funcref: reftype = "funcref"; break;
    case ValueType::Exnref:  reftype = "exnref"; break;
    case ValueType::Anyref:  reftype = "anyref"; break;

    default:
      WABT_UNREACHABLE;
      break;
  }

  // Handle ref types.
  return StringPrintf("%s:%" PRIzd, reftype, val.Get<Ref>().index);
}